

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O2

bool __thiscall
node::BlockManager::WriteUndoDataForBlock
          (BlockManager *this,CBlockUndo *blockundo,BlockValidationState *state,CBlockIndex *block)

{
  int iVar1;
  int iVar2;
  Notifications *notifications;
  string_view source_file;
  string_view source_file_00;
  bool bVar3;
  optional<node::BlockfileCursor> *poVar4;
  FlatFilePos FVar5;
  size_t sVar6;
  Logger *pLVar7;
  long in_FS_OFFSET;
  string_view str;
  string_view str_00;
  string_view logging_function;
  string_view logging_function_00;
  FlatFilePos _pos;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock19;
  __native_type local_e8 [3];
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = block->nHeight;
  iVar2 = (this->m_snapshot_height).super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._M_payload._M_value;
  bVar3 = (this->m_snapshot_height).super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._M_engaged;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&criticalblock19.super_unique_lock
             ,&this->cs_LastBlockFile,"cs_LastBlockFile",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
             ,999,false);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock19.super_unique_lock);
  poVar4 = inline_assertion_check<true,std::optional<node::BlockfileCursor>&>
                     ((this->m_blockfile_cursors)._M_elems + (byte)(iVar2 <= iVar1 & bVar3),
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
                      ,999,"WriteUndoDataForBlock",
                      "WITH_LOCK(cs_LastBlockFile, return m_blockfile_cursors[type])");
  FVar5 = CBlockIndex::GetUndoPos(block);
  bVar3 = true;
  if (FVar5.nFile == -1) {
    _pos.nFile = -1;
    _pos.nPos = 0;
    iVar1 = block->nFile;
    sVar6 = GetSerializeSize<CBlockUndo>(blockundo);
    bVar3 = FindUndoPos(this,state,iVar1,&_pos,(int)sVar6 + 0x28);
    if (bVar3) {
      CBlockIndex::GetBlockHash((uint256 *)&criticalblock19,block->pprev);
      bVar3 = UndoWriteToDisk(this,blockundo,&_pos,(uint256 *)&criticalblock19);
      if (bVar3) {
        iVar1 = (poVar4->super__Optional_base<node::BlockfileCursor,_true,_true>)._M_payload.
                super__Optional_payload_base<node::BlockfileCursor>._M_payload._M_value.file_num;
        if ((_pos.nFile < iVar1) &&
           (block->nHeight ==
            (this->m_blockfile_info).
            super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>._M_impl.
            super__Vector_impl_data._M_start[_pos.nFile].nHeightLast)) {
          bVar3 = FlushUndoFile(this,_pos.nFile,true);
          if (!bVar3) {
            bVar3 = ::LogAcceptCategory(BLOCKSTORAGE,Warning);
            if (bVar3) {
              pLVar7 = LogInstance();
              bVar3 = BCLog::Logger::Enabled(pLVar7);
              if (bVar3) {
                criticalblock19.super_unique_lock._M_device = (mutex_type *)local_e8;
                criticalblock19.super_unique_lock._M_owns = false;
                criticalblock19.super_unique_lock._9_7_ = 0;
                local_e8[0].__size[0] = '\0';
                tinyformat::format<int>(&local_58,"Failed to flush undo file %05i\n",&_pos.nFile);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &criticalblock19,&local_58);
                std::__cxx11::string::~string((string *)&local_58);
                pLVar7 = LogInstance();
                local_58._M_dataplus._M_p = (pointer)0x5e;
                local_58._M_string_length = 0x6a18e9;
                source_file._M_str =
                     "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
                ;
                source_file._M_len = 0x5e;
                str._M_str = (char *)criticalblock19.super_unique_lock._M_device;
                str._M_len = criticalblock19.super_unique_lock._8_8_;
                logging_function._M_str = "WriteUndoDataForBlock";
                logging_function._M_len = 0x15;
                BCLog::Logger::LogPrintStr
                          (pLVar7,str,logging_function,source_file,0x3ff,BLOCKSTORAGE,Warning);
                std::__cxx11::string::~string((string *)&criticalblock19);
              }
            }
          }
        }
        else if ((_pos.nFile == iVar1) &&
                ((poVar4->super__Optional_base<node::BlockfileCursor,_true,_true>)._M_payload.
                 super__Optional_payload_base<node::BlockfileCursor>._M_payload._M_value.undo_height
                 < block->nHeight)) {
          (poVar4->super__Optional_base<node::BlockfileCursor,_true,_true>)._M_payload.
          super__Optional_payload_base<node::BlockfileCursor>._M_payload._M_value.undo_height =
               block->nHeight;
        }
        bVar3 = true;
        block->nUndoPos = _pos.nPos;
        *(byte *)&block->nStatus = (byte)block->nStatus | 0x10;
        criticalblock19.super_unique_lock._M_device = (mutex_type *)block;
        std::
        _Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
        ::_M_insert_unique<CBlockIndex*>
                  ((_Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
                    *)&this->m_dirty_blockindex,(CBlockIndex **)&criticalblock19);
      }
      else {
        notifications = (this->m_opts).notifications;
        _((bilingual_str *)&criticalblock19,(ConstevalStringLiteral)0x6a223d);
        bVar3 = FatalError(notifications,state,(bilingual_str *)&criticalblock19);
        bilingual_str::~bilingual_str((bilingual_str *)&criticalblock19);
      }
    }
    else {
      pLVar7 = LogInstance();
      bVar3 = BCLog::Logger::Enabled(pLVar7);
      if (bVar3) {
        criticalblock19.super_unique_lock._M_device = (mutex_type *)local_e8;
        criticalblock19.super_unique_lock._M_owns = false;
        criticalblock19.super_unique_lock._9_7_ = 0;
        local_e8[0].__size[0] = '\0';
        tinyformat::format<char[22]>
                  (&local_58,"%s: FindUndoPos failed\n",(char (*) [22])"WriteUndoDataForBlock");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &criticalblock19,&local_58);
        std::__cxx11::string::~string((string *)&local_58);
        pLVar7 = LogInstance();
        local_58._M_dataplus._M_p = (pointer)0x5e;
        local_58._M_string_length = 0x6a18e9;
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
        ;
        source_file_00._M_len = 0x5e;
        str_00._M_str = (char *)criticalblock19.super_unique_lock._M_device;
        str_00._M_len = criticalblock19.super_unique_lock._8_8_;
        logging_function_00._M_str = "WriteUndoDataForBlock";
        logging_function_00._M_len = 0x15;
        BCLog::Logger::LogPrintStr(pLVar7,str_00,logging_function_00,source_file_00,0x3ed,ALL,Error)
        ;
        std::__cxx11::string::~string((string *)&criticalblock19);
      }
      bVar3 = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool BlockManager::WriteUndoDataForBlock(const CBlockUndo& blockundo, BlockValidationState& state, CBlockIndex& block)
{
    AssertLockHeld(::cs_main);
    const BlockfileType type = BlockfileTypeForHeight(block.nHeight);
    auto& cursor = *Assert(WITH_LOCK(cs_LastBlockFile, return m_blockfile_cursors[type]));

    // Write undo information to disk
    if (block.GetUndoPos().IsNull()) {
        FlatFilePos _pos;
        if (!FindUndoPos(state, block.nFile, _pos, ::GetSerializeSize(blockundo) + 40)) {
            LogError("%s: FindUndoPos failed\n", __func__);
            return false;
        }
        if (!UndoWriteToDisk(blockundo, _pos, block.pprev->GetBlockHash())) {
            return FatalError(m_opts.notifications, state, _("Failed to write undo data."));
        }
        // rev files are written in block height order, whereas blk files are written as blocks come in (often out of order)
        // we want to flush the rev (undo) file once we've written the last block, which is indicated by the last height
        // in the block file info as below; note that this does not catch the case where the undo writes are keeping up
        // with the block writes (usually when a synced up node is getting newly mined blocks) -- this case is caught in
        // the FindNextBlockPos function
        if (_pos.nFile < cursor.file_num && static_cast<uint32_t>(block.nHeight) == m_blockfile_info[_pos.nFile].nHeightLast) {
            // Do not propagate the return code, a failed flush here should not
            // be an indication for a failed write. If it were propagated here,
            // the caller would assume the undo data not to be written, when in
            // fact it is. Note though, that a failed flush might leave the data
            // file untrimmed.
            if (!FlushUndoFile(_pos.nFile, true)) {
                LogPrintLevel(BCLog::BLOCKSTORAGE, BCLog::Level::Warning, "Failed to flush undo file %05i\n", _pos.nFile);
            }
        } else if (_pos.nFile == cursor.file_num && block.nHeight > cursor.undo_height) {
            cursor.undo_height = block.nHeight;
        }
        // update nUndoPos in block index
        block.nUndoPos = _pos.nPos;
        block.nStatus |= BLOCK_HAVE_UNDO;
        m_dirty_blockindex.insert(&block);
    }

    return true;
}